

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# materialized_query_result.cpp
# Opt level: O2

ColumnDataCollection * __thiscall
duckdb::MaterializedQueryResult::Collection(MaterializedQueryResult *this)

{
  type pCVar1;
  InvalidInputException *this_00;
  InternalException *this_01;
  allocator local_59;
  string local_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  
  if ((this->super_QueryResult).super_BaseQueryResult.success == false) {
    this_00 = (InvalidInputException *)__cxa_allocate_exception(0x10);
    ::std::__cxx11::string::string
              ((string *)&local_58,
               "Attempting to get collection from an unsuccessful query result\n: Error %s",
               &local_59);
    ::std::__cxx11::string::string
              ((string *)&local_38,
               (string *)&(this->super_QueryResult).super_BaseQueryResult.error.final_message);
    InvalidInputException::InvalidInputException<std::__cxx11::string>(this_00,&local_58,&local_38);
    __cxa_throw(this_00,&InvalidInputException::typeinfo,::std::runtime_error::~runtime_error);
  }
  if ((this->collection).
      super_unique_ptr<duckdb::ColumnDataCollection,_std::default_delete<duckdb::ColumnDataCollection>_>
      ._M_t.
      super___uniq_ptr_impl<duckdb::ColumnDataCollection,_std::default_delete<duckdb::ColumnDataCollection>_>
      ._M_t.
      super__Tuple_impl<0UL,_duckdb::ColumnDataCollection_*,_std::default_delete<duckdb::ColumnDataCollection>_>
      .super__Head_base<0UL,_duckdb::ColumnDataCollection_*,_false>._M_head_impl !=
      (ColumnDataCollection *)0x0) {
    pCVar1 = unique_ptr<duckdb::ColumnDataCollection,_std::default_delete<duckdb::ColumnDataCollection>,_true>
             ::operator*(&this->collection);
    return pCVar1;
  }
  this_01 = (InternalException *)__cxa_allocate_exception(0x10);
  ::std::__cxx11::string::string
            ((string *)&local_58,"Missing collection from materialized query result",&local_59);
  InternalException::InternalException(this_01,(string *)&local_58);
  __cxa_throw(this_01,&InternalException::typeinfo,::std::runtime_error::~runtime_error);
}

Assistant:

ColumnDataCollection &MaterializedQueryResult::Collection() {
	if (HasError()) {
		throw InvalidInputException("Attempting to get collection from an unsuccessful query result\n: Error %s",
		                            GetError());
	}
	if (!collection) {
		throw InternalException("Missing collection from materialized query result");
	}
	return *collection;
}